

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverSyntaxTest_SyntaxProto2_Test::
DescriptorPoolTypeResolverSyntaxTest_SyntaxProto2_Test
          (DescriptorPoolTypeResolverSyntaxTest_SyntaxProto2_Test *this)

{
  DescriptorPoolTypeResolverSyntaxTest_SyntaxProto2_Test *this_local;
  
  DescriptorPoolTypeResolverSyntaxTest::DescriptorPoolTypeResolverSyntaxTest
            (&this->super_DescriptorPoolTypeResolverSyntaxTest);
  (this->super_DescriptorPoolTypeResolverSyntaxTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DescriptorPoolTypeResolverSyntaxTest_SyntaxProto2_Test_02a28ca8;
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverSyntaxTest, SyntaxProto2) {
  BuildFile(R"pb(
    package: "test"
    name: "foo"
    syntax: "proto2"
    message_type { name: "MyMessage" }
  )pb");

  Type type;
  ASSERT_TRUE(
      resolver_->ResolveMessageType(GetTypeUrl("test.MyMessage"), &type).ok());
  EXPECT_EQ(type.syntax(), Syntax::SYNTAX_PROTO2);
  EXPECT_EQ(type.edition(), "");
}